

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

bool embree::avx::OrientedDiscMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *Disc)

{
  undefined1 (*pauVar1) [12];
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  undefined1 auVar22 [32];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [24];
  undefined1 auVar26 [24];
  int iVar27;
  long lVar28;
  ulong uVar29;
  Scene *pSVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined4 uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [32];
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar51 [32];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  float fVar77;
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_2bc;
  Scene *local_2b8;
  Ray *local_2b0;
  RayQueryContext *local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  float local_298;
  undefined4 local_294;
  undefined4 local_290;
  uint local_28c;
  uint local_288;
  uint local_284;
  uint local_280;
  RTCFilterFunctionNArguments local_270;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  float local_80 [4];
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  local_2b0 = ray;
  local_2a8 = context;
  pSVar30 = context->scene;
  uVar8 = Disc->sharedGeomID;
  local_2b8 = pSVar30;
  pGVar9 = (pSVar30->geometries).items[uVar8].ptr;
  fVar48 = (pGVar9->time_range).lower;
  fVar48 = pGVar9->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar48) / ((pGVar9->time_range).upper - fVar48));
  auVar17 = vroundss_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),9);
  auVar17 = vminss_avx(auVar17,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar17 = vmaxss_avx(ZEXT816(0) << 0x20,auVar17);
  iVar27 = (int)auVar17._0_4_;
  uVar29 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar10 = *(long *)&pGVar9[2].numPrimitives;
  lVar28 = (long)iVar27 * 0x38;
  lVar11 = *(long *)(lVar10 + lVar28);
  lVar31 = *(long *)(lVar10 + 0x10 + lVar28);
  uVar35 = (ulong)(Disc->primIDs).field_0.i[1];
  pauVar1 = (undefined1 (*) [12])(lVar11 + lVar31 * uVar35);
  uVar38 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar39 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar34 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar43._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar34);
  auVar43._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar29);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[5];
  puVar2 = (undefined8 *)(lVar11 + lVar31 * uVar32);
  uVar23 = *puVar2;
  uVar24 = puVar2[1];
  fStack_1b4 = (float)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
  fStack_1b0 = (float)uVar23;
  fStack_1ac = (float)((ulong)uVar23 >> 0x20);
  fStack_1a8 = (float)uVar24;
  fStack_1a4 = (float)((ulong)uVar24 >> 0x20);
  uVar36 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar36);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar38);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar51._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar33);
  auVar51._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar39);
  p_Var12 = pGVar9[2].intersectionFilterN;
  lVar11 = *(long *)(p_Var12 + lVar28);
  lVar31 = *(long *)(p_Var12 + lVar28 + 0x10);
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar34);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar29);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar32);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar35);
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar36);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar38);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar33);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar31 * uVar39);
  lVar31 = (long)(iVar27 + 1) * 0x38;
  lVar11 = *(long *)(lVar10 + lVar31);
  lVar10 = *(long *)(lVar10 + 0x10 + lVar31);
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar34);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar29);
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar32);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar35);
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar36);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar38);
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar33);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar10 * uVar39);
  lVar10 = *(long *)(p_Var12 + lVar31);
  lVar11 = *(long *)(p_Var12 + lVar31 + 0x10);
  auVar80._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar34 * lVar11);
  auVar80._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar29 * lVar11);
  fVar48 = fVar48 - auVar17._0_4_;
  auVar44 = vunpcklps_avx(auVar43,auVar49);
  local_140 = vunpckhps_avx(auVar43,auVar49);
  auVar19._12_4_ = fStack_1b4;
  auVar19._0_12_ = *pauVar1;
  auVar19._16_4_ = fStack_1b0;
  auVar19._20_4_ = fStack_1ac;
  auVar19._24_4_ = fStack_1a8;
  auVar19._28_4_ = fStack_1a4;
  auVar43 = vunpcklps_avx(auVar19,auVar51);
  local_160 = vunpckhps_avx(auVar19,auVar51);
  auVar20 = vunpcklps_avx(auVar44,auVar43);
  auVar44 = vunpckhps_avx(auVar44,auVar43);
  auVar42 = vunpcklps_avx(auVar58,auVar45);
  auVar43 = vunpckhps_avx(auVar58,auVar45);
  auVar45 = vunpcklps_avx(auVar66,auVar72);
  auVar19 = vunpckhps_avx(auVar66,auVar72);
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar36 * lVar11);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar38 * lVar11);
  auVar46 = vunpcklps_avx(auVar43,auVar19);
  auVar51 = vunpcklps_avx(auVar42,auVar45);
  auVar43 = vunpckhps_avx(auVar42,auVar45);
  auVar19 = vunpcklps_avx(auVar73,auVar78);
  auVar49 = vunpckhps_avx(auVar73,auVar78);
  auVar42 = vunpcklps_avx(auVar76,auVar79);
  local_180 = vunpckhps_avx(auVar76,auVar79);
  auVar58 = vunpcklps_avx(auVar19,auVar42);
  auVar19 = vunpckhps_avx(auVar19,auVar42);
  auVar59 = vunpcklps_avx(auVar80,auVar67);
  auVar42 = vunpckhps_avx(auVar80,auVar67);
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar32 * lVar11);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar35 * lVar11);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar33);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar39 * lVar11);
  auVar60 = vunpcklps_avx(auVar74,auVar68);
  auVar45 = vunpckhps_avx(auVar74,auVar68);
  auVar66 = vunpcklps_avx(auVar42,auVar45);
  auVar42 = vunpcklps_avx(auVar59,auVar60);
  auVar45 = vunpckhps_avx(auVar59,auVar60);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),0);
  auVar18 = vshufps_avx(ZEXT416((uint)(1.0 - fVar48)),ZEXT416((uint)(1.0 - fVar48)),0);
  fVar13 = auVar17._0_4_;
  fVar14 = auVar17._4_4_;
  fVar15 = auVar17._8_4_;
  fVar16 = auVar17._12_4_;
  fVar63 = auVar18._0_4_;
  fVar64 = auVar18._4_4_;
  fVar65 = auVar18._8_4_;
  fVar62 = auVar18._12_4_;
  local_1c0 = fVar63 * auVar20._0_4_ + auVar58._0_4_ * fVar13;
  fStack_1bc = fVar64 * auVar20._4_4_ + auVar58._4_4_ * fVar14;
  fStack_1b8 = fVar65 * auVar20._8_4_ + auVar58._8_4_ * fVar15;
  fStack_1b4 = fVar62 * auVar20._12_4_ + auVar58._12_4_ * fVar16;
  fStack_1b0 = fVar63 * auVar20._16_4_ + auVar58._16_4_ * fVar13;
  fStack_1ac = fVar64 * auVar20._20_4_ + auVar58._20_4_ * fVar14;
  fStack_1a8 = fVar65 * auVar20._24_4_ + auVar58._24_4_ * fVar15;
  fStack_1a4 = auVar20._28_4_ + 0.0;
  auVar58 = vunpcklps_avx(local_140,local_160);
  local_1e0._0_4_ = auVar44._0_4_;
  local_1e0._4_4_ = auVar44._4_4_;
  fStack_1d8 = auVar44._8_4_;
  fStack_1d4 = auVar44._12_4_;
  fStack_1d0 = auVar44._16_4_;
  fStack_1cc = auVar44._20_4_;
  fStack_1c8 = auVar44._24_4_;
  auVar70._0_4_ = fVar63 * (float)local_1e0._0_4_ + fVar13 * auVar19._0_4_;
  auVar70._4_4_ = fVar64 * (float)local_1e0._4_4_ + fVar14 * auVar19._4_4_;
  auVar70._8_4_ = fVar65 * fStack_1d8 + fVar15 * auVar19._8_4_;
  auVar70._12_4_ = fVar62 * fStack_1d4 + fVar16 * auVar19._12_4_;
  auVar70._16_4_ = fVar63 * fStack_1d0 + fVar13 * auVar19._16_4_;
  auVar70._20_4_ = fVar64 * fStack_1cc + fVar14 * auVar19._20_4_;
  auVar70._24_4_ = fVar65 * fStack_1c8 + fVar15 * auVar19._24_4_;
  auVar70._28_4_ = local_160._28_4_ + auVar20._28_4_;
  _local_1e0 = auVar49;
  auVar44 = vunpcklps_avx(auVar49,local_180);
  local_220._0_4_ = fVar63 * auVar58._0_4_ + fVar13 * auVar44._0_4_;
  local_220._4_4_ = fVar64 * auVar58._4_4_ + fVar14 * auVar44._4_4_;
  local_220._8_4_ = fVar65 * auVar58._8_4_ + fVar15 * auVar44._8_4_;
  local_220._12_4_ = fVar62 * auVar58._12_4_ + fVar16 * auVar44._12_4_;
  local_220._16_4_ = fVar63 * auVar58._16_4_ + fVar13 * auVar44._16_4_;
  local_220._20_4_ = fVar64 * auVar58._20_4_ + fVar14 * auVar44._20_4_;
  local_220._24_4_ = fVar65 * auVar58._24_4_ + fVar15 * auVar44._24_4_;
  local_220._28_4_ = auVar58._28_4_ + auVar44._28_4_;
  fVar21 = auVar49._28_4_;
  fVar50 = fVar63 * auVar51._0_4_ + auVar42._0_4_ * fVar13;
  fVar52 = fVar64 * auVar51._4_4_ + auVar42._4_4_ * fVar14;
  fVar53 = fVar65 * auVar51._8_4_ + auVar42._8_4_ * fVar15;
  fVar54 = fVar62 * auVar51._12_4_ + auVar42._12_4_ * fVar16;
  fVar55 = fVar63 * auVar51._16_4_ + auVar42._16_4_ * fVar13;
  fVar56 = fVar64 * auVar51._20_4_ + auVar42._20_4_ * fVar14;
  fVar57 = fVar65 * auVar51._24_4_ + auVar42._24_4_ * fVar15;
  local_200._0_4_ = auVar43._0_4_;
  local_200._4_4_ = auVar43._4_4_;
  uStack_1f8._0_4_ = auVar43._8_4_;
  uStack_1f8._4_4_ = auVar43._12_4_;
  uStack_1f0._0_4_ = auVar43._16_4_;
  uStack_1f0._4_4_ = auVar43._20_4_;
  uStack_1e8._0_4_ = auVar43._24_4_;
  fVar75 = fVar63 * (float)local_200 + fVar13 * auVar45._0_4_;
  fVar77 = fVar64 * local_200._4_4_ + fVar14 * auVar45._4_4_;
  uStack_1f8._0_4_ = fVar65 * (float)uStack_1f8 + fVar15 * auVar45._8_4_;
  uStack_1f8._4_4_ = fVar62 * uStack_1f8._4_4_ + fVar16 * auVar45._12_4_;
  uStack_1f0._0_4_ = fVar63 * (float)uStack_1f0 + fVar13 * auVar45._16_4_;
  uStack_1f0._4_4_ = fVar64 * uStack_1f0._4_4_ + fVar14 * auVar45._20_4_;
  uStack_1e8._0_4_ = fVar65 * (float)uStack_1e8 + fVar15 * auVar45._24_4_;
  local_240._0_4_ = auVar46._0_4_;
  local_240._4_4_ = auVar46._4_4_;
  uStack_238._0_4_ = auVar46._8_4_;
  uStack_238._4_4_ = auVar46._12_4_;
  uStack_230._0_4_ = auVar46._16_4_;
  uStack_230._4_4_ = auVar46._20_4_;
  uStack_228._0_4_ = auVar46._24_4_;
  local_190 = vshufps_avx(ZEXT416(uVar8),ZEXT416(uVar8),0);
  local_1a0 = local_190;
  fVar48 = (ray->dir).field_0.m128[1];
  local_80[0] = fVar63 * (float)local_240 + fVar13 * auVar66._0_4_;
  local_80[1] = fVar64 * local_240._4_4_ + fVar14 * auVar66._4_4_;
  local_80[2] = fVar65 * (float)uStack_238 + fVar15 * auVar66._8_4_;
  local_80[3] = fVar62 * uStack_238._4_4_ + fVar16 * auVar66._12_4_;
  fStack_70 = fVar63 * (float)uStack_230 + fVar13 * auVar66._16_4_;
  fStack_6c = fVar64 * uStack_230._4_4_ + fVar14 * auVar66._20_4_;
  fStack_68 = fVar65 * (float)uStack_228 + fVar15 * auVar66._24_4_;
  fVar3 = (ray->dir).field_0.m128[2];
  fVar4 = (ray->dir).field_0.m128[0];
  auVar42._0_4_ = fVar4 * fVar50 + fVar48 * fVar75 + fVar3 * local_80[0];
  auVar42._4_4_ = fVar4 * fVar52 + fVar48 * fVar77 + fVar3 * local_80[1];
  auVar42._8_4_ = fVar4 * fVar53 + fVar48 * (float)uStack_1f8 + fVar3 * local_80[2];
  auVar42._12_4_ = fVar4 * fVar54 + fVar48 * uStack_1f8._4_4_ + fVar3 * local_80[3];
  auVar42._16_4_ = fVar4 * fVar55 + fVar48 * (float)uStack_1f0 + fVar3 * fStack_70;
  auVar42._20_4_ = fVar4 * fVar56 + fVar48 * uStack_1f0._4_4_ + fVar3 * fStack_6c;
  auVar42._24_4_ = fVar4 * fVar57 + fVar48 * (float)uStack_1e8 + fVar3 * fStack_68;
  auVar42._28_4_ = auVar19._28_4_ + fVar21 + 0.0;
  auVar17 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar44._16_16_ = auVar17;
  auVar44._0_16_ = auVar17;
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar43 = vcmpps_avx(_DAT_01f7b060,auVar44,1);
  auVar19 = vcmpps_avx(auVar42,ZEXT1632(ZEXT816(0) << 0x40),0);
  auVar59._8_4_ = 0x3f800000;
  auVar59._0_8_ = 0x3f8000003f800000;
  auVar59._12_4_ = 0x3f800000;
  auVar59._16_4_ = 0x3f800000;
  auVar59._20_4_ = 0x3f800000;
  auVar59._24_4_ = 0x3f800000;
  auVar59._28_4_ = 0x3f800000;
  auVar44 = vblendvps_avx(auVar42,auVar59,auVar19);
  fVar5 = (ray->org).field_0.m128[1];
  auVar81._4_4_ = fVar5;
  auVar81._0_4_ = fVar5;
  auVar81._8_4_ = fVar5;
  auVar81._12_4_ = fVar5;
  auVar81._16_4_ = fVar5;
  auVar81._20_4_ = fVar5;
  auVar81._24_4_ = fVar5;
  auVar81._28_4_ = fVar5;
  auVar43 = vandnps_avx(auVar19,auVar43);
  fVar6 = (ray->org).field_0.m128[2];
  auVar82._4_4_ = fVar6;
  auVar82._0_4_ = fVar6;
  auVar82._8_4_ = fVar6;
  auVar82._12_4_ = fVar6;
  auVar82._16_4_ = fVar6;
  auVar82._20_4_ = fVar6;
  auVar82._24_4_ = fVar6;
  auVar82._28_4_ = fVar6;
  auVar19 = vsubps_avx(local_220,auVar82);
  auVar42 = vsubps_avx(auVar70,auVar81);
  local_200 = CONCAT44(fVar77,fVar75);
  auVar26 = _local_200;
  uStack_1e8._4_4_ = fVar21 + auVar45._28_4_;
  auVar51 = _local_200;
  fVar7 = (ray->org).field_0.m128[0];
  auVar46._4_4_ = fVar7;
  auVar46._0_4_ = fVar7;
  auVar46._8_4_ = fVar7;
  auVar46._12_4_ = fVar7;
  auVar46._16_4_ = fVar7;
  auVar46._20_4_ = fVar7;
  auVar46._24_4_ = fVar7;
  auVar46._28_4_ = fVar7;
  auVar20._4_4_ = fStack_1bc;
  auVar20._0_4_ = local_1c0;
  auVar20._8_4_ = fStack_1b8;
  auVar20._12_4_ = fStack_1b4;
  auVar20._16_4_ = fStack_1b0;
  auVar20._20_4_ = fStack_1ac;
  auVar20._24_4_ = fStack_1a8;
  auVar20._28_4_ = fStack_1a4;
  auVar45 = vsubps_avx(auVar20,auVar46);
  local_240 = CONCAT44(fVar52,fVar50);
  uStack_238._0_4_ = fVar53;
  uStack_238._4_4_ = fVar54;
  uStack_230._0_4_ = fVar55;
  uStack_230._4_4_ = fVar56;
  auVar25 = _local_240;
  uStack_228._0_4_ = fVar57;
  uStack_228._4_4_ = fVar21 + auVar58._28_4_;
  auVar46 = _local_240;
  auVar60._0_4_ = auVar45._0_4_ * fVar50 + fVar75 * auVar42._0_4_ + local_80[0] * auVar19._0_4_;
  auVar60._4_4_ = auVar45._4_4_ * fVar52 + fVar77 * auVar42._4_4_ + local_80[1] * auVar19._4_4_;
  auVar60._8_4_ =
       auVar45._8_4_ * fVar53 + (float)uStack_1f8 * auVar42._8_4_ + local_80[2] * auVar19._8_4_;
  auVar60._12_4_ =
       auVar45._12_4_ * fVar54 + uStack_1f8._4_4_ * auVar42._12_4_ + local_80[3] * auVar19._12_4_;
  auVar60._16_4_ =
       auVar45._16_4_ * fVar55 + (float)uStack_1f0 * auVar42._16_4_ + fStack_70 * auVar19._16_4_;
  auVar60._20_4_ =
       auVar45._20_4_ * fVar56 + uStack_1f0._4_4_ * auVar42._20_4_ + fStack_6c * auVar19._20_4_;
  auVar60._24_4_ =
       auVar45._24_4_ * fVar57 + (float)uStack_1e8 * auVar42._24_4_ + fStack_68 * auVar19._24_4_;
  auVar60._28_4_ = auVar45._28_4_ + auVar42._28_4_ + auVar19._28_4_;
  local_e0 = vdivps_avx(auVar60,auVar44);
  uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar61._4_4_ = uVar37;
  auVar61._0_4_ = uVar37;
  auVar61._8_4_ = uVar37;
  auVar61._12_4_ = uVar37;
  auVar61._16_4_ = uVar37;
  auVar61._20_4_ = uVar37;
  auVar61._24_4_ = uVar37;
  auVar61._28_4_ = uVar37;
  fVar50 = ray->tfar;
  auVar71._4_4_ = fVar50;
  auVar71._0_4_ = fVar50;
  auVar71._8_4_ = fVar50;
  auVar71._12_4_ = fVar50;
  auVar71._16_4_ = fVar50;
  auVar71._20_4_ = fVar50;
  auVar71._24_4_ = fVar50;
  auVar71._28_4_ = fVar50;
  auVar44 = vcmpps_avx(auVar61,local_e0,2);
  auVar19 = vcmpps_avx(local_e0,auVar71,2);
  auVar44 = vandps_avx(auVar19,auVar44);
  auVar19 = auVar43 & auVar44;
  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0x7f,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar19 >> 0xbf,0) != '\0') ||
      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0') {
    auVar44 = vandps_avx(auVar44,auVar43);
    auVar43 = vunpckhps_avx(local_140,local_160);
    auVar19 = vunpckhps_avx(auVar49,local_180);
    fVar55 = fVar63 * auVar43._0_4_ + auVar19._0_4_ * fVar13;
    fVar56 = fVar64 * auVar43._4_4_ + auVar19._4_4_ * fVar14;
    fVar57 = fVar65 * auVar43._8_4_ + auVar19._8_4_ * fVar15;
    fVar62 = fVar62 * auVar43._12_4_ + auVar19._12_4_ * fVar16;
    fVar63 = fVar63 * auVar43._16_4_ + auVar19._16_4_ * fVar13;
    fVar64 = fVar64 * auVar43._20_4_ + auVar19._20_4_ * fVar14;
    fVar65 = fVar65 * auVar43._24_4_ + auVar19._24_4_ * fVar15;
    fVar50 = local_e0._0_4_;
    fVar13 = local_e0._4_4_;
    fVar14 = local_e0._8_4_;
    fVar15 = local_e0._12_4_;
    fVar52 = local_e0._16_4_;
    fVar53 = local_e0._20_4_;
    fVar54 = local_e0._24_4_;
    auVar40._0_4_ = fVar7 + fVar4 * fVar50;
    auVar40._4_4_ = fVar7 + fVar4 * fVar13;
    auVar40._8_4_ = fVar7 + fVar4 * fVar14;
    auVar40._12_4_ = fVar7 + fVar4 * fVar15;
    auVar40._16_4_ = fVar7 + fVar4 * fVar52;
    auVar40._20_4_ = fVar7 + fVar4 * fVar53;
    auVar40._24_4_ = fVar7 + fVar4 * fVar54;
    auVar40._28_4_ = fVar7 + fVar4;
    auVar47._0_4_ = fVar5 + fVar48 * fVar50;
    auVar47._4_4_ = fVar5 + fVar48 * fVar13;
    auVar47._8_4_ = fVar5 + fVar48 * fVar14;
    auVar47._12_4_ = fVar5 + fVar48 * fVar15;
    auVar47._16_4_ = fVar5 + fVar48 * fVar52;
    auVar47._20_4_ = fVar5 + fVar48 * fVar53;
    auVar47._24_4_ = fVar5 + fVar48 * fVar54;
    auVar47._28_4_ = fVar5 + fVar7;
    auVar69._0_4_ = fVar6 + fVar3 * fVar50;
    auVar69._4_4_ = fVar6 + fVar3 * fVar13;
    auVar69._8_4_ = fVar6 + fVar3 * fVar14;
    auVar69._12_4_ = fVar6 + fVar3 * fVar15;
    auVar69._16_4_ = fVar6 + fVar3 * fVar52;
    auVar69._20_4_ = fVar6 + fVar3 * fVar53;
    auVar69._24_4_ = fVar6 + fVar3 * fVar54;
    auVar69._28_4_ = fVar6 + fVar16;
    auVar43 = vsubps_avx(auVar40,auVar20);
    auVar19 = vsubps_avx(auVar47,auVar70);
    auVar42 = vsubps_avx(auVar69,local_220);
    fVar48 = auVar19._28_4_ + auVar42._28_4_;
    auVar41._0_4_ =
         auVar43._0_4_ * auVar43._0_4_ +
         auVar19._0_4_ * auVar19._0_4_ + auVar42._0_4_ * auVar42._0_4_;
    auVar41._4_4_ =
         auVar43._4_4_ * auVar43._4_4_ +
         auVar19._4_4_ * auVar19._4_4_ + auVar42._4_4_ * auVar42._4_4_;
    auVar41._8_4_ =
         auVar43._8_4_ * auVar43._8_4_ +
         auVar19._8_4_ * auVar19._8_4_ + auVar42._8_4_ * auVar42._8_4_;
    auVar41._12_4_ =
         auVar43._12_4_ * auVar43._12_4_ +
         auVar19._12_4_ * auVar19._12_4_ + auVar42._12_4_ * auVar42._12_4_;
    auVar41._16_4_ =
         auVar43._16_4_ * auVar43._16_4_ +
         auVar19._16_4_ * auVar19._16_4_ + auVar42._16_4_ * auVar42._16_4_;
    auVar41._20_4_ =
         auVar43._20_4_ * auVar43._20_4_ +
         auVar19._20_4_ * auVar19._20_4_ + auVar42._20_4_ * auVar42._20_4_;
    auVar41._24_4_ =
         auVar43._24_4_ * auVar43._24_4_ +
         auVar19._24_4_ * auVar19._24_4_ + auVar42._24_4_ * auVar42._24_4_;
    auVar41._28_4_ = auVar43._28_4_ + fVar48;
    auVar22._4_4_ = fVar56 * fVar56;
    auVar22._0_4_ = fVar55 * fVar55;
    auVar22._8_4_ = fVar57 * fVar57;
    auVar22._12_4_ = fVar62 * fVar62;
    auVar22._16_4_ = fVar63 * fVar63;
    auVar22._20_4_ = fVar64 * fVar64;
    auVar22._24_4_ = fVar65 * fVar65;
    auVar22._28_4_ = fVar48;
    auVar43 = vcmpps_avx(auVar41,auVar22,1);
    auVar19 = auVar44 & auVar43;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      fVar48 = ray->tfar;
      auVar44 = vandps_avx(auVar43,auVar44);
      local_100 = ZEXT832(0) << 0x20;
      local_120 = ZEXT832(0) << 0x20;
      uStack_230 = auVar25._16_8_;
      uStack_228 = auVar46._24_8_;
      local_c0 = local_240;
      uStack_b8 = uStack_238;
      uStack_b0 = uStack_230;
      uStack_a8 = uStack_228;
      uStack_1f0 = auVar26._16_8_;
      uStack_1e8 = auVar51._24_8_;
      local_a0 = local_200;
      uStack_98 = uStack_1f8;
      uStack_90 = uStack_1f0;
      uStack_88 = uStack_1e8;
      fStack_64 = fVar21 + auVar66._28_4_;
      uVar37 = vmovmskps_avx(auVar44);
      uVar39 = CONCAT44((int)(uVar38 * lVar11 >> 0x20),uVar37);
      _local_240 = auVar46;
      _local_200 = auVar51;
      do {
        local_270.hit = (RTCHitN *)&local_2a0;
        local_270.valid = &local_2bc;
        uVar29 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        pGVar9 = (pSVar30->geometries).items[*(uint *)(local_1a0 + uVar29 * 4)].ptr;
        if ((pGVar9->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_220._0_4_ = fVar48;
          local_2a0 = *(undefined4 *)((long)&local_c0 + uVar29 * 4);
          local_29c = *(undefined4 *)((long)&local_a0 + uVar29 * 4);
          local_298 = local_80[uVar29];
          local_294 = *(undefined4 *)(local_120 + uVar29 * 4);
          local_290 = *(undefined4 *)(local_100 + uVar29 * 4);
          local_28c = (Disc->primIDs).field_0.i[uVar29];
          local_288 = *(uint *)(local_1a0 + uVar29 * 4);
          local_284 = context->user->instID[0];
          local_280 = context->user->instPrimID[0];
          ray->tfar = *(float *)(local_e0 + uVar29 * 4);
          local_2bc = -1;
          local_270.geometryUserPtr = pGVar9->userPtr;
          local_270.context = context->user;
          local_270.N = 1;
          local_270.ray = (RTCRayN *)ray;
          if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar9->occlusionFilterN)(&local_270), *local_270.valid != 0)) {
            p_Var12 = context->args->filter;
            if ((p_Var12 == (RTCFilterFunctionN)0x0) ||
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar9->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var12)(&local_270), *local_270.valid != 0)))) {
              return true;
            }
          }
          local_2b0->tfar = (float)local_220._0_4_;
          pSVar30 = local_2b8;
          ray = local_2b0;
          fVar48 = (float)local_220._0_4_;
        }
        uVar39 = uVar39 ^ 1L << (uVar29 & 0x3f);
      } while (uVar39 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        return DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Occluded1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }